

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

HitCounter * __thiscall
el::base::utils::RegistryWithPred<el::base::HitCounter,el::base::HitCounter::Predicate>::
get<char_const*,unsigned_long>
          (RegistryWithPred<el::base::HitCounter,el::base::HitCounter::Predicate> *this,char **arg1,
          unsigned_long arg2)

{
  bool bVar1;
  vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_> *pvVar2;
  reference ppHVar3;
  bool bVar4;
  __normal_iterator<el::base::HitCounter_**,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
  local_58;
  Predicate local_50;
  __normal_iterator<el::base::HitCounter_**,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
  local_40;
  __normal_iterator<el::base::HitCounter_**,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
  local_38;
  __normal_iterator<el::base::HitCounter_**,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
  local_30;
  iterator iter;
  unsigned_long arg2_local;
  char **arg1_local;
  RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate> *this_local;
  
  iter._M_current = (HitCounter **)arg2;
  pvVar2 = (vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_> *)
           (**(code **)(*(long *)this + 0x58))();
  local_38._M_current =
       (HitCounter **)
       std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>::begin(pvVar2);
  pvVar2 = (vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_> *)
           (**(code **)(*(long *)this + 0x58))();
  local_40._M_current =
       (HitCounter **)
       std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>::end(pvVar2);
  HitCounter::Predicate::Predicate(&local_50,*arg1,(LineNumber)iter._M_current);
  local_30 = ::std::
             find_if<__gnu_cxx::__normal_iterator<el::base::HitCounter**,std::vector<el::base::HitCounter*,std::allocator<el::base::HitCounter*>>>,el::base::HitCounter::Predicate>
                       (local_38,local_40,local_50);
  pvVar2 = (vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_> *)
           (**(code **)(*(long *)this + 0x58))();
  local_58._M_current =
       (HitCounter **)
       std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>::end(pvVar2);
  bVar1 = __gnu_cxx::operator!=(&local_30,&local_58);
  bVar4 = false;
  if (bVar1) {
    ppHVar3 = __gnu_cxx::
              __normal_iterator<el::base::HitCounter_**,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
              ::operator*(&local_30);
    bVar4 = *ppHVar3 != (HitCounter *)0x0;
  }
  if (bVar4) {
    ppHVar3 = __gnu_cxx::
              __normal_iterator<el::base::HitCounter_**,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
              ::operator*(&local_30);
    this_local = (RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate> *)*ppHVar3
    ;
  }
  else {
    this_local = (RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate> *)0x0;
  }
  return (HitCounter *)this_local;
}

Assistant:

T_Ptr* get(const T& arg1, const T2 arg2) {
    iterator iter = std::find_if(this->list().begin(), this->list().end(), Pred(arg1, arg2));
    if (iter != this->list().end() && *iter != nullptr) {
      return *iter;
    }
    return nullptr;
  }